

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qzip.cpp
# Opt level: O2

QByteArray * __thiscall
QZipReader::fileData(QByteArray *__return_storage_ptr__,QZipReader *this,QString *fileName)

{
  long lVar1;
  QIODevice *pQVar2;
  Data *pDVar3;
  qsizetype qVar4;
  ushort uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uchar auVar8 [4];
  uchar auVar9 [4];
  long lVar10;
  bool bVar11;
  int iVar12;
  long lVar13;
  QZipReaderPrivate *pQVar14;
  undefined4 extraout_var;
  char *pcVar15;
  ulong uVar16;
  undefined1 *__nbytes;
  __off_t __length;
  char *pcVar17;
  long lVar18;
  ulong uVar19;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_168;
  undefined1 local_148 [8];
  uchar auStack_140 [4];
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  char *local_130;
  ulong uStack_128;
  ulong local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined1 *local_d8;
  ushort uStack_d0;
  undefined4 uStack_ce;
  undefined2 uStack_ca;
  undefined6 uStack_c8;
  undefined1 *puStack_c2;
  FileHeader header;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QZipReaderPrivate::scanFiles(this->d);
  lVar18 = 0x30;
  lVar10 = 0;
  uVar19 = 0;
  do {
    uVar16 = uVar19;
    lVar13 = lVar10;
    pQVar14 = this->d;
    uVar19 = (pQVar14->super_QZipPrivate).fileHeaders.d.size;
    if (uVar19 <= uVar16) goto LAB_0024bd9f;
    QString::fromLocal8Bit<void>
              ((QString *)&header,
               (QByteArray *)
               ((((pQVar14->super_QZipPrivate).fileHeaders.d.ptr)->h).signature + lVar18));
    bVar11 = ::comparesEqual((QString *)&header,fileName);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&header);
    lVar18 = lVar18 + 0x78;
    lVar10 = lVar13 + -0x78;
    uVar19 = uVar16 + 1;
  } while (!bVar11);
  pQVar14 = this->d;
  uVar19 = (pQVar14->super_QZipPrivate).fileHeaders.d.size;
LAB_0024bd9f:
  if (uVar19 == uVar16) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
    goto LAB_0024c1a3;
  }
  __nbytes = &DAT_aaaaaaaaaaaaaaaa;
  header.file_comment.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  header.file_comment.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  header.file_comment.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  header.extra_field.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  header.extra_field.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  header.file_name.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  header.extra_field.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  header.file_name.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  header.file_name.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  header.h._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  header._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
  header.h._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  header.h._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  header.h._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  header.h._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  FileHeader::FileHeader
            (&header,(FileHeader *)((long)(pQVar14->super_QZipPrivate).fileHeaders.d.ptr - lVar13));
  uVar7 = header.h._16_8_;
  uVar6 = header.h._8_8_;
  if ((ushort)header.h.version_needed < 0x15) {
    auVar8 = header.h.compressed_size;
    auVar9 = header.h.uncompressed_size;
    pcVar17 = (char *)(long)(int)header.h.uncompressed_size;
    pQVar2 = (this->d->super_QZipPrivate).device;
    (*(pQVar2->super_QObject)._vptr_QObject[0x11])(pQVar2,(long)(int)header.h.offset_local_header);
    uStack_c8 = 0xaaaaaaaaaaaa;
    puStack_c2 = &DAT_aaaaaaaaaaaaaaaa;
    local_d8 = &DAT_aaaaaaaaaaaaaaaa;
    uStack_d0 = 0xaaaa;
    uStack_ce = 0xaaaaaaaa;
    uStack_ca = 0xaaaa;
    QIODevice::read((this->d->super_QZipPrivate).device,(int)&local_d8,(void *)0x1e,(size_t)__nbytes
                   );
    uVar19 = (ulong)puStack_c2 >> 0x20;
    uVar16 = (ulong)puStack_c2 >> 0x30;
    pQVar2 = (this->d->super_QZipPrivate).device;
    iVar12 = (*(pQVar2->super_QObject)._vptr_QObject[0xf])(pQVar2);
    (*(pQVar2->super_QObject)._vptr_QObject[0x11])
              (pQVar2,uVar16 + (uVar19 & 0xffff) + CONCAT44(extraout_var,iVar12));
    uVar5 = uStack_d0;
    if ((uVar6 & 1) != 0) {
      local_148._0_4_ = 2;
      uStack_134 = 0;
      local_148._4_4_ = 0;
      auStack_140[0] = '\0';
      auStack_140[1] = '\0';
      auStack_140[2] = '\0';
      auStack_140[3] = '\0';
      uStack_13c = 0;
      uStack_138 = 0;
      local_130 = "default";
      QMessageLogger::warning
                ((QMessageLogger *)local_148,
                 "QZip: Unsupported encryption method is needed to extract the data.");
      goto LAB_0024bfa1;
    }
    local_168.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_168.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_168.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QIODevice::read((QIODevice *)&local_168,(int)(this->d->super_QZipPrivate).device,
                    (char *)(long)(int)auVar8,(size_t)__nbytes);
    if (uVar5 != 8) {
      if (uVar5 == 0) {
        QByteArray::truncate((QByteArray *)&local_168,pcVar17,__length);
        qVar4 = local_168.size;
        pcVar17 = local_168.ptr;
        pDVar3 = local_168.d;
        local_168.d = (Data *)0x0;
        local_168.ptr = (char *)0x0;
        (__return_storage_ptr__->d).d = pDVar3;
        (__return_storage_ptr__->d).ptr = pcVar17;
        local_168.size = 0;
        (__return_storage_ptr__->d).size = qVar4;
      }
      else {
        local_148._0_4_ = 2;
        uStack_134 = 0;
        local_148._4_4_ = 0;
        auStack_140[0] = '\0';
        auStack_140[1] = '\0';
        auStack_140[2] = '\0';
        auStack_140[3] = '\0';
        uStack_13c = 0;
        uStack_138 = 0;
        local_130 = "default";
        QMessageLogger::warning
                  ((QMessageLogger *)local_148,
                   "QZip: Unsupported compression method %d is needed to extract the data.",
                   (ulong)uVar5);
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char *)0x0;
        (__return_storage_ptr__->d).size = 0;
      }
      goto switchD_0024c0cc_caseD_fffffffe;
    }
    QByteArray::truncate((QByteArray *)&local_168,(char *)(long)(int)auVar8,__length);
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
    pcVar15 = (char *)0x1;
    if (1 < (int)auVar9) {
      pcVar15 = pcVar17;
    }
    uVar19 = (ulong)pcVar15 & 0xffffffff;
    while( true ) {
      QByteArray::resize(__return_storage_ptr__,uVar19);
      pcVar15 = QByteArray::data(__return_storage_ptr__);
      uVar6 = header.h._16_8_;
      pcVar17 = local_168.ptr;
      if (local_168.ptr == (char *)0x0) {
        pcVar17 = &QByteArray::_empty;
      }
      local_e0 = 0;
      local_f0 = 0;
      uStack_e8 = 0;
      local_100 = 0;
      uStack_f8 = 0;
      local_110 = 0;
      uStack_108 = 0;
      local_120 = 0;
      uStack_118 = 0;
      local_130 = (char *)0x0;
      uStack_128 = 0;
      uStack_13c = 0;
      uStack_138 = 0;
      uStack_134 = 0;
      local_148._0_4_ = SUB84(pcVar17,0);
      local_148._4_4_ = (undefined4)((ulong)pcVar17 >> 0x20);
      header.h.compressed_size[0] = auVar8[0];
      header.h.compressed_size[1] = auVar8[1];
      header.h.compressed_size[2] = auVar8[2];
      header.h.compressed_size[3] = auVar8[3];
      auStack_140[0] = header.h.compressed_size[0];
      auStack_140[1] = header.h.compressed_size[1];
      auStack_140[2] = header.h.compressed_size[2];
      auStack_140[3] = header.h.compressed_size[3];
      header.h._16_8_ = uVar6;
      if ((-1 < (long)uVar7) &&
         (uStack_128 = uVar19 & 0xffffffff, local_130 = pcVar15, uVar19 >> 0x20 == 0)) break;
switchD_0024c0cc_caseD_fffffffb:
      uVar19 = uVar19 * 2;
    }
    iVar12 = inflateInit2_(local_148,0xfffffffffffffff1,"1.2.11",0x70);
    if (iVar12 == 0) {
      iVar12 = inflate(local_148,4);
      uVar16 = local_120;
      if (iVar12 == 1) {
        iVar12 = inflateEnd(local_148);
        uVar19 = uVar16;
        goto LAB_0024c0b7;
      }
      inflateEnd(local_148);
      if ((iVar12 != 2) && ((iVar12 != -5 || (auStack_140 != (uchar  [4])0x0)))) goto LAB_0024c0b7;
switchD_0024c0cc_caseD_fffffffd:
      local_148._0_4_ = 2;
      uStack_134 = 0;
      local_148._4_4_ = 0;
      auStack_140[0] = '\0';
      auStack_140[1] = '\0';
      auStack_140[2] = '\0';
      auStack_140[3] = '\0';
      uStack_13c = 0;
      uStack_138 = 0;
      local_130 = "default";
      QMessageLogger::warning
                ((QMessageLogger *)local_148,"QZip: Z_DATA_ERROR: Input data is corrupted");
    }
    else {
LAB_0024c0b7:
      switch(iVar12) {
      case 0:
        if ((long)(int)uVar19 != (__return_storage_ptr__->d).size) {
          QByteArray::resize(__return_storage_ptr__,uVar19);
        }
        break;
      case -5:
        goto switchD_0024c0cc_caseD_fffffffb;
      case -4:
        local_148._0_4_ = 2;
        uStack_134 = 0;
        local_148._4_4_ = 0;
        auStack_140[0] = '\0';
        auStack_140[1] = '\0';
        auStack_140[2] = '\0';
        auStack_140[3] = '\0';
        uStack_13c = 0;
        uStack_138 = 0;
        local_130 = "default";
        QMessageLogger::warning((QMessageLogger *)local_148,"QZip: Z_MEM_ERROR: Not enough memory");
        break;
      case -3:
        goto switchD_0024c0cc_caseD_fffffffd;
      }
    }
switchD_0024c0cc_caseD_fffffffe:
    QArrayDataPointer<char>::~QArrayDataPointer(&local_168);
  }
  else {
    local_148._0_4_ = 2;
    uStack_134 = 0;
    local_148._4_4_ = 0;
    auStack_140[0] = '\0';
    auStack_140[1] = '\0';
    auStack_140[2] = '\0';
    auStack_140[3] = '\0';
    uStack_13c = 0;
    uStack_138 = 0;
    local_130 = "default";
    QMessageLogger::warning
              ((QMessageLogger *)local_148,
               "QZip: .ZIP specification version %d implementationis needed to extract the data.");
LAB_0024bfa1:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  FileHeader::~FileHeader(&header);
LAB_0024c1a3:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QZipReader::fileData(const QString &fileName) const
{
    d->scanFiles();
    int i;
    for (i = 0; i < d->fileHeaders.size(); ++i) {
        if (QString::fromLocal8Bit(d->fileHeaders.at(i).file_name) == fileName)
            break;
    }
    if (i == d->fileHeaders.size())
        return QByteArray();

    FileHeader header = d->fileHeaders.at(i);

    ushort version_needed = readUShort(header.h.version_needed);
    if (version_needed > ZIP_VERSION) {
        qWarning("QZip: .ZIP specification version %d implementationis needed to extract the data.", version_needed);
        return QByteArray();
    }

    ushort general_purpose_bits = readUShort(header.h.general_purpose_bits);
    int compressed_size = readUInt(header.h.compressed_size);
    int uncompressed_size = readUInt(header.h.uncompressed_size);
    int start = readUInt(header.h.offset_local_header);
    //qDebug("uncompressing file %d: local header at %d", i, start);

    d->device->seek(start);
    LocalFileHeader lh;
    d->device->read((char *)&lh, sizeof(LocalFileHeader));
    uint skip = readUShort(lh.file_name_length) + readUShort(lh.extra_field_length);
    d->device->seek(d->device->pos() + skip);

    int compression_method = readUShort(lh.compression_method);
    //qDebug("file=%s: compressed_size=%d, uncompressed_size=%d", fileName.toLocal8Bit().data(), compressed_size, uncompressed_size);

    if ((general_purpose_bits & Encrypted) != 0) {
        qWarning("QZip: Unsupported encryption method is needed to extract the data.");
        return QByteArray();
    }

    //qDebug("file at %lld", d->device->pos());
    QByteArray compressed = d->device->read(compressed_size);
    if (compression_method == CompressionMethodStored) {
        // no compression
        compressed.truncate(uncompressed_size);
        return compressed;
    } else if (compression_method == CompressionMethodDeflated) {
        // Deflate
        //qDebug("compressed=%d", compressed.size());
        compressed.truncate(compressed_size);
        QByteArray baunzip;
        ulong len = qMax(uncompressed_size,  1);
        int res;
        do {
            baunzip.resize(len);
            res = inflate((uchar*)baunzip.data(), &len,
                          (const uchar*)compressed.constData(), compressed_size);

            switch (res) {
            case Z_OK:
                if ((int)len != baunzip.size())
                    baunzip.resize(len);
                break;
            case Z_MEM_ERROR:
                qWarning("QZip: Z_MEM_ERROR: Not enough memory");
                break;
            case Z_BUF_ERROR:
                len *= 2;
                break;
            case Z_DATA_ERROR:
                qWarning("QZip: Z_DATA_ERROR: Input data is corrupted");
                break;
            }
        } while (res == Z_BUF_ERROR);
        return baunzip;
    }

    qWarning("QZip: Unsupported compression method %d is needed to extract the data.", compression_method);
    return QByteArray();
}